

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Output::endMapping(Output *this)

{
  size_t sVar1;
  ulong uVar2;
  StringRef Str;
  
  uVar2 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                 super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                 super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                 super_SmallVectorBase.Size;
  if (uVar2 == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0xa7,
                  "reference llvm::SmallVectorTemplateCommon<llvm::yaml::Output::InState>::back() [T = llvm::yaml::Output::InState]"
                 );
  }
  if (*(int *)((long)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                     super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                     super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                     super_SmallVectorBase.BeginX + uVar2 * 4 + -4) == 4) {
    sVar1 = (this->PaddingBeforeContainer).Length;
    (this->Padding).Data = (this->PaddingBeforeContainer).Data;
    (this->Padding).Length = sVar1;
    newLineCheck(this);
    this->Column = this->Column + 2;
    Str.Length = 2;
    Str.Data = "{}";
    raw_ostream::operator<<(this->Out,Str);
    (this->Padding).Data = "\n";
    (this->Padding).Length = 1;
    uVar2 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                   super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                   super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                   super_SmallVectorBase.Size;
  }
  if (uVar2 - 1 <=
      (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
             super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
             super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
             super_SmallVectorBase.Capacity) {
    (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
    super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
    super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size =
         (uint)(uVar2 - 1);
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void Output::endMapping() {
  // If we did not map anything, we should explicitly emit an empty map
  if (StateStack.back() == inMapFirstKey) {
    Padding = PaddingBeforeContainer;
    newLineCheck();
    output("{}");
    Padding = "\n";
  }
  StateStack.pop_back();
}